

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederate.cpp
# Opt level: O2

void __thiscall
helics::ValueFederate::registerValueInterfacesJsonDetail
          (ValueFederate *this,JsonBuffer *jsonBuff,bool defaultGlobal)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  string_view units_00;
  string_view units_01;
  string_view units_02;
  string_view units_03;
  string_view units_04;
  undefined8 uVar10;
  bool bVar11;
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
  *pbVar12;
  const_reference pvVar13;
  fileops *pfVar14;
  anon_class_8_1_66e10193 callback;
  reference pbVar15;
  anon_class_8_1_6bff8b70 callback_00;
  anon_class_8_1_ba1d534b callback_01;
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
  *pbVar16;
  ulong in_R9;
  string_view key;
  string_view key_00;
  string_view name_00;
  string_view info_00;
  string_view target;
  string_view target_00;
  string_view target_01;
  string_view key_01;
  string_view target_02;
  string_view key_02;
  string_view key_03;
  string_view name_01;
  string_view type_00;
  string_view type_01;
  string_view type_02;
  string_view type_03;
  string_view type_04;
  string type;
  string defStr;
  string name_1;
  string info;
  value_type targets;
  string units;
  value_type targets_1;
  const_iterator __begin2;
  string name;
  const_iterator __end2;
  bool local_281;
  ValueFederate *local_280;
  undefined1 local_278 [24];
  code *local_260;
  key_type local_250;
  undefined1 local_230 [24];
  code *local_218;
  allocator<char> local_209;
  string local_208;
  key_type local_1e8;
  undefined1 local_1c8 [24];
  code *local_1b0;
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
  *local_1a8;
  data local_1a0;
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
  *local_190;
  const_iterator local_188;
  double local_168;
  string local_160;
  ValueFederate *local_140;
  Publication *pPStack_138;
  ValueFederate *local_130;
  Publication *pPStack_128;
  ValueFederate *local_120;
  Publication *pPStack_118;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  const_iterator local_50;
  
  pbVar16 = (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
             *)jsonBuff->reference;
  local_281 = defaultGlobal;
  local_280 = this;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_278,"defaultglobal",(allocator<char> *)local_1c8);
  fileops::replaceIfMember((json *)pbVar16,(string *)local_278,&local_281);
  std::__cxx11::string::~string((string *)local_278);
  bVar11 = nlohmann::json_abi_v3_11_3::
           basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
           ::contains<const_char_(&)[11],_0>
                     ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                       *)pbVar16,(char (*) [11])0x3478b1);
  pbVar12 = pbVar16;
  if (bVar11) {
    pbVar12 = (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
               *)nlohmann::json_abi_v3_11_3::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                 ::operator[]<char_const>(pbVar16,"interfaces");
  }
  bVar11 = nlohmann::json_abi_v3_11_3::
           basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
           ::contains<const_char_(&)[13],_0>
                     ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                       *)pbVar12,(char (*) [13])0x3493ec);
  local_1a8 = pbVar16;
  local_190 = pbVar12;
  if (bVar11) {
    pvVar13 = nlohmann::json_abi_v3_11_3::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
              ::operator[]<char_const>(pbVar12,"publications");
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::cbegin(&local_188,pvVar13);
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::cend(&local_50,pvVar13);
    while( true ) {
      bVar11 = nlohmann::json_abi_v3_11_3::detail::
               iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
               ::
               operator!=<nlohmann::json_abi_v3_11_3::detail::iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_nullptr>
                         (&local_188,&local_50);
      if (!bVar11) break;
      pfVar14 = (fileops *)
                nlohmann::json_abi_v3_11_3::detail::
                iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                ::operator*(&local_188);
      fileops::getName(&local_160,(json *)pfVar14);
      key._M_str = local_160._M_dataplus._M_p;
      key._M_len = local_160._M_string_length;
      callback.pubAct =
           ValueFederateManager::getPublication
                     ((local_280->vfManager)._M_t.
                      super___uniq_ptr_impl<helics::ValueFederateManager,_std::default_delete<helics::ValueFederateManager>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_helics::ValueFederateManager_*,_std::default_delete<helics::ValueFederateManager>_>
                      .super__Head_base<0UL,_helics::ValueFederateManager_*,_false>._M_head_impl,key
                     );
      if (((callback.pubAct)->super_Interface).handle.hid == -1700000000) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_1c8,"type",(allocator<char> *)local_230);
        auVar1._8_8_ = 0;
        auVar1._0_8_ = in_R9;
        fileops::getOrDefault
                  ((string *)local_278,pfVar14,(json *)local_1c8,(string *)0x0,
                   (string_view)(auVar1 << 0x40));
        std::__cxx11::string::~string((string *)local_1c8);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_230,"unit",(allocator<char> *)&local_250);
        auVar2._8_8_ = 0;
        auVar2._0_8_ = in_R9;
        fileops::getOrDefault
                  ((string *)local_1c8,pfVar14,(json *)local_230,(string *)0x0,
                   (string_view)(auVar2 << 0x40));
        std::__cxx11::string::~string((string *)local_230);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_230,"units",(allocator<char> *)&local_250);
        fileops::replaceIfMember((json *)pfVar14,(string *)local_230,(string *)local_1c8);
        std::__cxx11::string::~string((string *)local_230);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_230,"global",(allocator<char> *)&local_250);
        bVar11 = fileops::getOrDefault((json *)pfVar14,(string *)local_230,local_281);
        std::__cxx11::string::~string((string *)local_230);
        if (bVar11) {
          local_230._0_8_ = local_1c8._8_8_;
          local_230._8_8_ = local_1c8._0_8_;
          units_00._M_str = (char *)local_1c8._0_8_;
          units_00._M_len = local_1c8._8_8_;
          key_00._M_str = local_160._M_dataplus._M_p;
          key_00._M_len = local_160._M_string_length;
          type_00._M_str = (char *)local_278._0_8_;
          type_00._M_len = local_278._8_8_;
          callback.pubAct =
               ValueFederateManager::registerPublication
                         ((local_280->vfManager)._M_t.
                          super___uniq_ptr_impl<helics::ValueFederateManager,_std::default_delete<helics::ValueFederateManager>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_helics::ValueFederateManager_*,_std::default_delete<helics::ValueFederateManager>_>
                          .super__Head_base<0UL,_helics::ValueFederateManager_*,_false>._M_head_impl
                          ,key_00,type_00,units_00);
        }
        else {
          local_120 = (ValueFederate *)local_1c8._8_8_;
          pPStack_118 = (Publication *)local_1c8._0_8_;
          units_01._M_str = (char *)local_1c8._0_8_;
          units_01._M_len = local_1c8._8_8_;
          name_00._M_str = local_160._M_dataplus._M_p;
          name_00._M_len = local_160._M_string_length;
          type_01._M_str = (char *)local_278._0_8_;
          type_01._M_len = local_278._8_8_;
          callback.pubAct = registerPublication(local_280,name_00,type_01,units_01);
        }
        std::__cxx11::string::~string((string *)local_1c8);
        std::__cxx11::string::~string((string *)local_278);
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_250,"flags",(allocator<char> *)&local_1a0);
      local_208._M_string_length = (size_type)local_280;
      local_208._M_dataplus._M_p = (pointer)callback.pubAct;
      bVar11 = nlohmann::json_abi_v3_11_3::
               basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
               ::contains((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                           *)pfVar14,&local_250);
      if (bVar11) {
        pvVar13 = nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  ::operator[]((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                *)pfVar14,&local_250);
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)&local_1e8,pvVar13);
        if ((char)local_1e8._M_dataplus._M_p == '\x02') {
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::begin((iterator *)local_278,
                  (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                   *)&local_1e8);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::end((iterator *)local_1c8,
                (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                 *)&local_1e8);
          while (bVar11 = nlohmann::json_abi_v3_11_3::detail::
                          iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                          ::
                          operator!=<nlohmann::json_abi_v3_11_3::detail::iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_nullptr>
                                    ((iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                                      *)local_278,
                                     (iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                                      *)local_1c8), bVar11) {
            pbVar15 = nlohmann::json_abi_v3_11_3::detail::
                      iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                      ::operator*((iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                                   *)local_278);
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::
            get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      ((string *)local_230,pbVar15);
            loadOptions<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_helics::Publication>
            ::anon_class_16_2_5e8ce78e::operator()
                      ((anon_class_16_2_5e8ce78e *)&local_208,(string *)local_230);
            std::__cxx11::string::~string((string *)local_230);
            nlohmann::json_abi_v3_11_3::detail::
            iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
            ::operator++((iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                          *)local_278);
          }
        }
        else {
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::
          get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    ((string *)local_278,
                     (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)&local_1e8);
          loadOptions<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_helics::Publication>
          ::anon_class_16_2_5e8ce78e::operator()
                    ((anon_class_16_2_5e8ce78e *)&local_208,(string *)local_278);
          std::__cxx11::string::~string((string *)local_278);
        }
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::data::~data((data *)&local_1e8);
      }
      if (local_250._M_dataplus._M_p[local_250._M_string_length - 1] == 's') {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        pop_back(&local_250);
        bVar11 = nlohmann::json_abi_v3_11_3::
                 basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                 ::contains((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                             *)pfVar14,&local_250);
        if (bVar11) {
          pvVar13 = nlohmann::json_abi_v3_11_3::
                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    ::operator[]((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                  *)pfVar14,&local_250);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::
          get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    ((string *)local_278,pvVar13);
          loadOptions<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_helics::Publication>
          ::anon_class_16_2_5e8ce78e::operator()
                    ((anon_class_16_2_5e8ce78e *)&local_208,(string *)local_278);
          std::__cxx11::string::~string((string *)local_278);
        }
      }
      std::__cxx11::string::~string((string *)&local_250);
      local_278._0_8_ = (pointer)0x0;
      local_278._8_8_ = (_Base_ptr)0x0;
      local_260 = std::
                  _Function_handler<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/ValueFederate.cpp:226:9)>
                  ::_M_invoke;
      local_278._16_8_ =
           std::
           _Function_handler<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/ValueFederate.cpp:226:9)>
           ::_M_manager;
      local_1c8._0_8_ = (pointer)0x0;
      local_1c8._8_8_ = (_Base_ptr)0x0;
      local_1b0 = std::
                  _Function_handler<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/ValueFederate.cpp:227:9)>
                  ::_M_invoke;
      local_230._8_8_ = (Publication *)0x0;
      local_1c8._16_8_ =
           std::
           _Function_handler<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/ValueFederate.cpp:227:9)>
           ::_M_manager;
      local_218 = std::
                  _Function_handler<void_(int,_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/ValueFederate.cpp:228:9)>
                  ::_M_invoke;
      local_230._16_8_ =
           std::
           _Function_handler<void_(int,_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/ValueFederate.cpp:228:9)>
           ::_M_manager;
      local_230._0_8_ = callback.pubAct;
      processOptions((json *)pfVar14,
                     (function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                      *)local_278,
                     (function<int_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                      *)local_1c8,(function<void_(int,_int)> *)local_230);
      CLI::std::_Function_base::~_Function_base((_Function_base *)local_230);
      CLI::std::_Function_base::~_Function_base((_Function_base *)local_1c8);
      CLI::std::_Function_base::~_Function_base((_Function_base *)local_278);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_278,"alias",(allocator<char> *)local_230);
      local_1c8._8_8_ = local_280;
      local_1b0 = std::
                  _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/ValueFederate.cpp:230:42)>
                  ::_M_invoke;
      local_1c8._16_8_ =
           std::
           _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/ValueFederate.cpp:230:42)>
           ::_M_manager;
      local_1c8._0_8_ = callback.pubAct;
      fileops::callIfMember
                ((json *)pfVar14,(string *)local_278,
                 (function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                  *)local_1c8);
      CLI::std::_Function_base::~_Function_base((_Function_base *)local_1c8);
      std::__cxx11::string::~string((string *)local_278);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_278,"tolerance",(allocator<char> *)local_1c8);
      local_168 = fileops::getOrDefault((json *)pfVar14,(string *)local_278,-1.0);
      std::__cxx11::string::~string((string *)local_278);
      if (0.0 < local_168) {
        if ((callback.pubAct)->delta <= 0.0 && (callback.pubAct)->delta != 0.0) {
          (callback.pubAct)->changeDetectionEnabled = true;
        }
        (callback.pubAct)->delta = local_168;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_278,"info",(allocator<char> *)local_1c8);
      auVar3._8_8_ = 0;
      auVar3._0_8_ = in_R9;
      fileops::getOrDefault
                (&local_208,pfVar14,(json *)local_278,(string *)0x0,(string_view)(auVar3 << 0x40));
      std::__cxx11::string::~string((string *)local_278);
      if ((ValueFederate *)local_208._M_string_length != (ValueFederate *)0x0) {
        info_00._M_str = local_208._M_dataplus._M_p;
        info_00._M_len = local_208._M_string_length;
        Interface::setInfo(&(callback.pubAct)->super_Interface,info_00);
      }
      local_278._8_8_ = (_Base_ptr)0x0;
      local_260 = std::
                  _Function_handler<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/ValueFederate.cpp:242:20)>
                  ::_M_invoke;
      local_278._16_8_ =
           std::
           _Function_handler<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/ValueFederate.cpp:242:20)>
           ::_M_manager;
      local_278._0_8_ = callback.pubAct;
      loadTags((json *)pfVar14,
               (function<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
                *)local_278);
      CLI::std::_Function_base::~_Function_base((_Function_base *)local_278);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e8,"targets",&local_209);
      bVar11 = nlohmann::json_abi_v3_11_3::
               basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
               ::contains((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                           *)pfVar14,&local_1e8);
      if (bVar11) {
        pvVar13 = nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  ::operator[]((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                *)pfVar14,&local_1e8);
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)&local_1a0,pvVar13);
        if (local_1a0.m_type == array) {
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::begin((iterator *)local_278,
                  (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                   *)&local_1a0);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::end((iterator *)local_1c8,
                (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                 *)&local_1a0);
          while (bVar11 = nlohmann::json_abi_v3_11_3::detail::
                          iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                          ::
                          operator!=<nlohmann::json_abi_v3_11_3::detail::iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_nullptr>
                                    ((iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                                      *)local_278,
                                     (iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                                      *)local_1c8), bVar11) {
            pbVar15 = nlohmann::json_abi_v3_11_3::detail::
                      iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                      ::operator*((iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                                   *)local_278);
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::
            get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      ((string *)local_230,pbVar15);
            target._M_str = (char *)local_230._0_8_;
            target._M_len = local_230._8_8_;
            Publication::addTarget(callback.pubAct,target);
            std::__cxx11::string::~string((string *)local_230);
            nlohmann::json_abi_v3_11_3::detail::
            iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
            ::operator++((iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                          *)local_278);
          }
        }
        else {
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::
          get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    ((string *)local_278,
                     (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)&local_1a0);
          target_00._M_str = (char *)local_278._0_8_;
          target_00._M_len = local_278._8_8_;
          Publication::addTarget(callback.pubAct,target_00);
          std::__cxx11::string::~string((string *)local_278);
        }
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::data::~data(&local_1a0);
      }
      if ((local_1e8._M_dataplus._M_p + -1)[local_1e8._M_string_length] == 's') {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        pop_back(&local_1e8);
        bVar11 = nlohmann::json_abi_v3_11_3::
                 basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                 ::contains((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                             *)pfVar14,&local_1e8);
        if (bVar11) {
          pvVar13 = nlohmann::json_abi_v3_11_3::
                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    ::operator[]((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                  *)pfVar14,&local_1e8);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::
          get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    ((string *)local_278,pvVar13);
          target_01._M_str = (char *)local_278._0_8_;
          target_01._M_len = local_278._8_8_;
          Publication::addTarget(callback.pubAct,target_01);
          std::__cxx11::string::~string((string *)local_278);
        }
      }
      std::__cxx11::string::~string((string *)&local_1e8);
      std::__cxx11::string::~string((string *)&local_208);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_278,"destination",(allocator<char> *)local_1c8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_70,"inputs",(allocator<char> *)local_230);
      addTargetVariations<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,helics::ValueFederate::registerValueInterfacesJsonDetail(helics::fileops::JsonBuffer_const&,bool)::__0>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)pfVar14,(string *)local_278,&local_70,callback);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)local_278);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_278,"destination",(allocator<char> *)local_1c8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_90,"targets",(allocator<char> *)local_230);
      addTargetVariations<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,helics::ValueFederate::registerValueInterfacesJsonDetail(helics::fileops::JsonBuffer_const&,bool)::__0>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)pfVar14,(string *)local_278,&local_90,callback);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)local_278);
      std::__cxx11::string::~string((string *)&local_160);
      nlohmann::json_abi_v3_11_3::detail::
      iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
      ::operator++(&local_188);
    }
  }
  pbVar12 = local_190;
  pbVar16 = local_1a8;
  bVar11 = nlohmann::json_abi_v3_11_3::
           basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
           ::contains<const_char_(&)[14],_0>
                     ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                       *)local_190,(char (*) [14])"subscriptions");
  if (bVar11) {
    pvVar13 = nlohmann::json_abi_v3_11_3::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
              ::operator[]<char_const>(pbVar12,"subscriptions");
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::cbegin((const_iterator *)local_278,pvVar13);
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::cend((const_iterator *)local_1c8,pvVar13);
    while( true ) {
      bVar11 = nlohmann::json_abi_v3_11_3::detail::
               iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
               ::
               operator!=<nlohmann::json_abi_v3_11_3::detail::iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_nullptr>
                         ((iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                           *)local_278,
                          (iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                           *)local_1c8);
      pbVar16 = local_1a8;
      pbVar12 = local_190;
      if (!bVar11) break;
      pfVar14 = (fileops *)
                nlohmann::json_abi_v3_11_3::detail::
                iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                ::operator*((iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                             *)local_278);
      fileops::getName((string *)local_230,(json *)pfVar14);
      uVar10 = local_230._8_8_;
      if ((Publication *)local_230._8_8_ == (Publication *)0x0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_250,"target",(allocator<char> *)&local_208);
        fileops::replaceIfMember((json *)pfVar14,(string *)&local_250,(string *)local_230);
        std::__cxx11::string::~string((string *)&local_250);
      }
      key_01._M_str = (char *)local_230._0_8_;
      key_01._M_len = local_230._8_8_;
      callback_00.subAct =
           ValueFederateManager::getInputByTarget
                     ((local_280->vfManager)._M_t.
                      super___uniq_ptr_impl<helics::ValueFederateManager,_std::default_delete<helics::ValueFederateManager>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_helics::ValueFederateManager_*,_std::default_delete<helics::ValueFederateManager>_>
                      .super__Head_base<0UL,_helics::ValueFederateManager_*,_false>._M_head_impl,
                      key_01);
      if (((callback_00.subAct)->super_Interface).handle.hid == -1700000000) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_208,"type",(allocator<char> *)&local_1e8);
        auVar4._8_8_ = 0;
        auVar4._0_8_ = in_R9;
        fileops::getOrDefault
                  ((string *)&local_250,pfVar14,(json *)&local_208,(string *)0x0,
                   (string_view)(auVar4 << 0x40));
        std::__cxx11::string::~string((string *)&local_208);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1e8,"unit",(allocator<char> *)&local_188);
        auVar5._8_8_ = 0;
        auVar5._0_8_ = in_R9;
        fileops::getOrDefault
                  (&local_208,pfVar14,(json *)&local_1e8,(string *)0x0,(string_view)(auVar5 << 0x40)
                  );
        std::__cxx11::string::~string((string *)&local_1e8);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1e8,"units",(allocator<char> *)&local_188);
        fileops::replaceIfMember((json *)pfVar14,(string *)&local_1e8,&local_208);
        std::__cxx11::string::~string((string *)&local_1e8);
        local_130 = (ValueFederate *)local_208._M_string_length;
        pPStack_128 = (Publication *)local_208._M_dataplus._M_p;
        units_02._M_str = local_208._M_dataplus._M_p;
        units_02._M_len = local_208._M_string_length;
        type_02._M_str = local_250._M_dataplus._M_p;
        type_02._M_len = local_250._M_string_length;
        callback_00.subAct = registerInput(local_280,(string_view)ZEXT816(0),type_02,units_02);
        if ((Publication *)uVar10 != (Publication *)0x0) {
          target_02._M_str = (char *)local_230._0_8_;
          target_02._M_len = local_230._8_8_;
          Input::addPublication(callback_00.subAct,target_02);
        }
        std::__cxx11::string::~string((string *)&local_208);
        std::__cxx11::string::~string((string *)&local_250);
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_208,"default",(allocator<char> *)&local_1e8);
      auVar6._8_8_ = 0;
      auVar6._0_8_ = in_R9;
      fileops::getOrDefault
                ((string *)&local_250,pfVar14,(json *)&local_208,(string *)0x0,
                 (string_view)(auVar6 << 0x40));
      std::__cxx11::string::~string((string *)&local_208);
      if (local_250._M_string_length != 0) {
        std::
        variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
        ::operator=((variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                     *)&(callback_00.subAct)->lastValue,&local_250);
      }
      loadOptions<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,helics::Input>
                (local_280,
                 (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)pfVar14,callback_00.subAct);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_208,"source",(allocator<char> *)&local_1e8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b0,"publications",(allocator<char> *)&local_188);
      addTargetVariations<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,helics::ValueFederate::registerValueInterfacesJsonDetail(helics::fileops::JsonBuffer_const&,bool)::__1>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)pfVar14,&local_208,&local_b0,callback_00);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_208);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_208,"source",(allocator<char> *)&local_1e8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_d0,"targets",(allocator<char> *)&local_188);
      addTargetVariations<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,helics::ValueFederate::registerValueInterfacesJsonDetail(helics::fileops::JsonBuffer_const&,bool)::__1>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)pfVar14,&local_208,&local_d0,callback_00);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_208);
      std::__cxx11::string::~string((string *)&local_250);
      std::__cxx11::string::~string((string *)local_230);
      nlohmann::json_abi_v3_11_3::detail::
      iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
      ::operator++((iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                    *)local_278);
    }
  }
  bVar11 = nlohmann::json_abi_v3_11_3::
           basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
           ::contains<const_char_(&)[7],_0>
                     ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                       *)pbVar12,(char (*) [7])0x3493d9);
  if (bVar11) {
    pvVar13 = nlohmann::json_abi_v3_11_3::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
              ::operator[]<char_const>(pbVar12,"inputs");
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::cbegin((const_iterator *)local_278,pvVar13);
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::cend((const_iterator *)local_1c8,pvVar13);
    while( true ) {
      bVar11 = nlohmann::json_abi_v3_11_3::detail::
               iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
               ::
               operator!=<nlohmann::json_abi_v3_11_3::detail::iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_nullptr>
                         ((iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                           *)local_278,
                          (iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                           *)local_1c8);
      pbVar16 = local_1a8;
      if (!bVar11) break;
      pfVar14 = (fileops *)
                nlohmann::json_abi_v3_11_3::detail::
                iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                ::operator*((iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                             *)local_278);
      fileops::getName((string *)local_230,(json *)pfVar14);
      key_02._M_str = (char *)local_230._0_8_;
      key_02._M_len = local_230._8_8_;
      callback_01.inp =
           ValueFederateManager::getInput
                     ((local_280->vfManager)._M_t.
                      super___uniq_ptr_impl<helics::ValueFederateManager,_std::default_delete<helics::ValueFederateManager>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_helics::ValueFederateManager_*,_std::default_delete<helics::ValueFederateManager>_>
                      .super__Head_base<0UL,_helics::ValueFederateManager_*,_false>._M_head_impl,
                      key_02);
      if (((callback_01.inp)->super_Interface).handle.hid == -1700000000) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_208,"type",(allocator<char> *)&local_1e8);
        auVar7._8_8_ = 0;
        auVar7._0_8_ = in_R9;
        fileops::getOrDefault
                  ((string *)&local_250,pfVar14,(json *)&local_208,(string *)0x0,
                   (string_view)(auVar7 << 0x40));
        std::__cxx11::string::~string((string *)&local_208);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1e8,"unit",(allocator<char> *)&local_188);
        auVar8._8_8_ = 0;
        auVar8._0_8_ = in_R9;
        fileops::getOrDefault
                  (&local_208,pfVar14,(json *)&local_1e8,(string *)0x0,(string_view)(auVar8 << 0x40)
                  );
        std::__cxx11::string::~string((string *)&local_1e8);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1e8,"units",(allocator<char> *)&local_188);
        fileops::replaceIfMember((json *)pfVar14,(string *)&local_1e8,&local_208);
        std::__cxx11::string::~string((string *)&local_1e8);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1e8,"global",(allocator<char> *)&local_188);
        bVar11 = fileops::getOrDefault((json *)pfVar14,(string *)&local_1e8,local_281);
        std::__cxx11::string::~string((string *)&local_1e8);
        if (bVar11) {
          local_1e8._M_dataplus._M_p = (pointer)local_208._M_string_length;
          local_1e8._M_string_length = (size_type)local_208._M_dataplus._M_p;
          units_03._M_str = local_208._M_dataplus._M_p;
          units_03._M_len = local_208._M_string_length;
          key_03._M_str = (char *)local_230._0_8_;
          key_03._M_len = local_230._8_8_;
          type_03._M_str = local_250._M_dataplus._M_p;
          type_03._M_len = local_250._M_string_length;
          callback_01.inp =
               ValueFederateManager::registerInput
                         ((local_280->vfManager)._M_t.
                          super___uniq_ptr_impl<helics::ValueFederateManager,_std::default_delete<helics::ValueFederateManager>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_helics::ValueFederateManager_*,_std::default_delete<helics::ValueFederateManager>_>
                          .super__Head_base<0UL,_helics::ValueFederateManager_*,_false>._M_head_impl
                          ,key_03,type_03,units_03);
        }
        else {
          local_140 = (ValueFederate *)local_208._M_string_length;
          pPStack_138 = (Publication *)local_208._M_dataplus._M_p;
          units_04._M_str = local_208._M_dataplus._M_p;
          units_04._M_len = local_208._M_string_length;
          name_01._M_str = (char *)local_230._0_8_;
          name_01._M_len = local_230._8_8_;
          type_04._M_str = local_250._M_dataplus._M_p;
          type_04._M_len = local_250._M_string_length;
          callback_01.inp = registerInput(local_280,name_01,type_04,units_04);
        }
        std::__cxx11::string::~string((string *)&local_208);
        std::__cxx11::string::~string((string *)&local_250);
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_208,"default",(allocator<char> *)&local_1e8);
      auVar9._8_8_ = 0;
      auVar9._0_8_ = in_R9;
      fileops::getOrDefault
                ((string *)&local_250,pfVar14,(json *)&local_208,(string *)0x0,
                 (string_view)(auVar9 << 0x40));
      std::__cxx11::string::~string((string *)&local_208);
      if (local_250._M_string_length != 0) {
        std::
        variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
        ::operator=((variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                     *)&(callback_01.inp)->lastValue,&local_250);
      }
      loadOptions<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,helics::Input>
                (local_280,
                 (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)pfVar14,callback_01.inp);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_208,"source",(allocator<char> *)&local_1e8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f0,"publications",(allocator<char> *)&local_188);
      addTargetVariations<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,helics::ValueFederate::registerValueInterfacesJsonDetail(helics::fileops::JsonBuffer_const&,bool)::__2>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)pfVar14,&local_208,&local_f0,callback_01);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_208);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_208,"source",(allocator<char> *)&local_1e8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_110,"targets",(allocator<char> *)&local_188);
      addTargetVariations<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,helics::ValueFederate::registerValueInterfacesJsonDetail(helics::fileops::JsonBuffer_const&,bool)::__2>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)pfVar14,&local_208,&local_110,callback_01);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::~string((string *)&local_208);
      std::__cxx11::string::~string((string *)&local_250);
      std::__cxx11::string::~string((string *)local_230);
      nlohmann::json_abi_v3_11_3::detail::
      iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
      ::operator++((iter_impl<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                    *)local_278);
    }
  }
  bVar11 = nlohmann::json_abi_v3_11_3::
           basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
           ::contains<const_char_(&)[7],_0>
                     ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                       *)pbVar16,(char (*) [7])0x33c7c9);
  if (bVar11) {
    local_278._0_8_ =
         nlohmann::json_abi_v3_11_3::
         basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
         ::operator[]<char_const>(pbVar16,"helics");
    registerValueInterfacesJsonDetail(local_280,(JsonBuffer *)local_278,local_281);
  }
  return;
}

Assistant:

void ValueFederate::registerValueInterfacesJsonDetail(const fileops::JsonBuffer& jsonBuff,
                                                      bool defaultGlobal)
{
    const auto& json = jsonBuff.json();
    fileops::replaceIfMember(json, "defaultglobal", defaultGlobal);

    const nlohmann::json& iface = (json.contains("interfaces")) ? json["interfaces"] : json;

    if (iface.contains("publications")) {
        const auto& pubs = iface["publications"];
        for (const auto& pub : pubs) {
            auto name = fileops::getName(pub);

            Publication* pubAct = &vfManager->getPublication(name);
            if (!pubAct->isValid()) {
                auto type = fileops::getOrDefault(pub, "type", emptyStr);
                auto units = fileops::getOrDefault(pub, "unit", emptyStr);
                fileops::replaceIfMember(pub, "units", units);
                const bool global = fileops::getOrDefault(pub, "global", defaultGlobal);
                if (global) {
                    pubAct = &registerGlobalPublication(name, type, units);
                } else {
                    pubAct = &registerPublication(name, type, units);
                }
            }

            loadOptions(this, pub, *pubAct);
            auto addDestTarget = [pubAct](const std::string& target) {
                pubAct->addDestinationTarget(target);
            };
            addTargetVariations(pub, "destination", "inputs", addDestTarget);
            addTargetVariations(pub, "destination", "targets", addDestTarget);
        }
    }
    if (iface.contains("subscriptions")) {
        const auto& subs = iface["subscriptions"];
        for (const auto& sub : subs) {
            bool skipNameTarget{false};
            auto name = fileops::getName(sub);
            if (name.empty()) {
                fileops::replaceIfMember(sub, "target", name);
                skipNameTarget = true;
            }
            auto* subAct = &vfManager->getInputByTarget(name);
            if (!subAct->isValid()) {
                auto type = fileops::getOrDefault(sub, "type", emptyStr);
                auto units = fileops::getOrDefault(sub, "unit", emptyStr);
                fileops::replaceIfMember(sub, "units", units);
                subAct = &registerInput(emptyStr, type, units);
                if (!skipNameTarget) {
                    // this check is to prevent some warnings since targets get added later
                    subAct->addTarget(name);
                }
            }
            auto defStr = fileops::getOrDefault(sub, "default", emptyStr);
            if (!defStr.empty()) {
                subAct->setDefault(defStr);
            }
            loadOptions(this, sub, *subAct);
            auto addSourceTarget = [subAct](const std::string& target) {
                subAct->addSourceTarget(target);
            };
            addTargetVariations(sub, "source", "publications", addSourceTarget);
            addTargetVariations(sub, "source", "targets", addSourceTarget);
        }
    }
    if (iface.contains("inputs")) {
        const auto& ipts = iface["inputs"];
        for (const auto& ipt : ipts) {
            auto name = fileops::getName(ipt);

            Input* inp = &vfManager->getInput(name);
            if (!inp->isValid()) {
                auto type = fileops::getOrDefault(ipt, "type", emptyStr);
                auto units = fileops::getOrDefault(ipt, "unit", emptyStr);
                fileops::replaceIfMember(ipt, "units", units);
                const bool global = fileops::getOrDefault(ipt, "global", defaultGlobal);
                if (global) {
                    inp = &registerGlobalInput(name, type, units);
                } else {
                    inp = &registerInput(name, type, units);
                }
            }
            auto defStr = fileops::getOrDefault(ipt, "default", emptyStr);
            if (!defStr.empty()) {
                inp->setDefault(defStr);
            }
            loadOptions(this, ipt, *inp);
            auto addSourceTarget = [inp](const std::string& target) {
                inp->addSourceTarget(target);
            };
            addTargetVariations(ipt, "source", "publications", addSourceTarget);
            addTargetVariations(ipt, "source", "targets", addSourceTarget);
        }
    }

    if (json.contains("helics")) {
        registerValueInterfacesJsonDetail(json["helics"], defaultGlobal);
    }
}